

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_tie_rope(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long in_RSI;
  OBJ_AFFECT_DATA oaf;
  OBJ_DATA *obj2;
  OBJ_AFFECT_DATA *in_stack_ffffffffffffff88;
  OBJ_DATA *in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  OBJ_DATA *in_stack_ffffffffffffffb0;
  OBJ_DATA *local_20;
  
  if (*(short *)(*(long *)(in_RSI + 0xa8) + 0x13a) == 0x5fe4) {
    local_20 = *(OBJ_DATA **)(*(long *)(in_RSI + 0xa8) + 0x20);
    while ((local_20 != (OBJ_DATA *)0x0 && (local_20->pIndexData->vnum != 0x5fe4))) {
      local_20 = local_20->next_content;
    }
    bVar1 = is_affected_obj(local_20,(int)gsn_trip);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                    CONCAT24(in_stack_ffffffffffffffa4,
                                             CONCAT22(in_stack_ffffffffffffffa2,
                                                      in_stack_ffffffffffffffa0))),
                   in_stack_ffffffffffffff98);
    }
    else {
      act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                           CONCAT24(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
          in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
      act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                           CONCAT24(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
          in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
      init_affect_obj((OBJ_AFFECT_DATA *)0x66b0eb);
      affect_to_obj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      obj_from_char(in_stack_ffffffffffffffb0);
      extract_obj(in_stack_ffffffffffffffb0);
    }
  }
  else {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT24(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))),
                 in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void verb_prog_tie_rope(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj2;
	OBJ_AFFECT_DATA oaf;

	if (ch->in_room->vnum != 24548)
	{
		send_to_char("There is nothing to tie the rope to here!\n\r", ch);
		return;
	}

	for (obj2 = ch->in_room->contents; obj2 != nullptr; obj2 = obj2->next_content)
	{
		if (obj2->pIndexData->vnum == 24548)
			break;
	}

	if (is_affected_obj(obj2, gsn_trip))
	{
		send_to_char("There is already a rope tied to that wheel!\n\r", ch);
		return;
	}

	act("You tie a length of rope between the wheel and the metal plate.", ch, 0, 0, TO_CHAR);
	act("$n ties a length of rope between the wheel and the metal plate.", ch, 0, 0, TO_ROOM);

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.duration = 12;
	oaf.type = gsn_trip;
	oaf.end_fun = rope_end;
	affect_to_obj(obj2, &oaf);

	obj_from_char(obj);
	extract_obj(obj);
}